

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::PrintKeys(cmCursesMainForm *this,int process)

{
  FORM *form;
  bool bVar1;
  FIELD *field;
  long *plVar2;
  size_t sVar3;
  char *pcVar4;
  char *__src;
  int iVar5;
  char fmt_s [3];
  char firstLine [512];
  char fmt [512];
  char thirdLine [512];
  char secondLine [512];
  undefined2 local_83c;
  undefined1 local_83a;
  char local_838 [512];
  char local_638 [512];
  char local_438 [512];
  char local_238 [520];
  
  if (_stdscr == 0) {
    return;
  }
  if ((short)*(ushort *)(_stdscr + 6) < 0x40) {
    return;
  }
  iVar5 = (int)*(short *)(_stdscr + 4);
  if (*(short *)(_stdscr + 4) < 5 || (int)(*(ushort *)(_stdscr + 6) + 1) < this->InitialWidth) {
    return;
  }
  form = (this->super_cmCursesForm).Form;
  bVar1 = true;
  if (form != (FORM *)0x0) {
    field = current_field(form);
    plVar2 = (long *)field_userptr(field);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x30))(plVar2);
      bVar1 = false;
      goto LAB_00227115;
    }
  }
  plVar2 = (long *)0x0;
LAB_00227115:
  memset(local_838,0,0x200);
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  if (process == 0) {
    if (this->OkToGenerate == true) {
      builtin_strncpy(local_838 + 0x30,"te and exit",0xc);
      builtin_strncpy(local_838 + 0x20,"ss [g] to genera",0x10);
      builtin_strncpy(local_838 + 0x18,"     Pre",8);
    }
    else {
      builtin_strncpy(local_838 + 0x30,"         ",10);
      builtin_strncpy(local_838 + 0x20,"                ",0x10);
      builtin_strncpy(local_838 + 0x18,"        ",8);
    }
    builtin_strncpy(local_838,"Press [c] to configure  ",0x18);
    pcVar4 = "Off";
    if (this->AdvancedMode != false) {
      pcVar4 = "On";
    }
    sprintf(local_438,"Press [t] to toggle advanced mode (Currently %s)",pcVar4);
    __src = "Press [h] for help           Press [q] to quit without generating";
    pcVar4 = local_238;
    sVar3 = 0x42;
  }
  else {
    memcpy(local_838,"                                                                    ",0x45);
    memcpy(local_238,"                                                                    ",0x45);
    pcVar4 = local_438;
    sVar3 = 0x45;
    __src = "                                                                    ";
  }
  memcpy(pcVar4,__src,sVar3);
  move(iVar5 + -3,0);
  local_83a = 0;
  local_83c = 0x7325;
  memcpy(local_638,"Press [enter] to edit option",0x200);
  if (process != 0) {
    builtin_strncpy(local_638 + 0x14,"       ",8);
    builtin_strncpy(local_638,"                    ",0x14);
  }
  printw(&local_83c,local_638);
  move(iVar5 + -2,0);
  printw(&local_83c,local_838);
  move(iVar5 + -1,0);
  printw(&local_83c,local_238);
  move(iVar5,0);
  printw(&local_83c,local_438);
  if (!bVar1) {
    sprintf(local_838,"Page %d of %d",(ulong)*(uint *)(plVar2 + 7),(ulong)(uint)this->NumberOfPages)
    ;
    sVar3 = strlen(local_838);
    move(0,0x40 - (int)sVar3);
    printw(&local_83c,local_838);
  }
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesMainForm::PrintKeys(int process /* = 0 */)
{
  int x,y;
  getmaxyx(stdscr, y, x);
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       x < this->InitialWidth               ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    return;
    }

  // Give the current widget (if it exists), a chance to print keys
  cmCursesWidget* cw = 0;
  if (this->Form)
    {
    FIELD* currentField = current_field(this->Form);
    cw = reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
    }

  if (cw)
    {
    cw->PrintKeys();
    }

//    {
//    }
//  else
//    {
  char firstLine[512]="";
  char secondLine[512]="";
  char thirdLine[512]="";
  if (process)
    {
    const char* clearLine =
      "                                                                    ";
    strcpy(firstLine, clearLine);
    strcpy(secondLine, clearLine);
    strcpy(thirdLine, clearLine);
    }
  else
    {
    if (this->OkToGenerate)
      {
      sprintf(firstLine,
              "Press [c] to configure       Press [g] to generate and exit");
      }
    else
      {
      sprintf(firstLine,  "Press [c] to configure                                   ");
      }
    {
      const char* toggleKeyInstruction =
        "Press [t] to toggle advanced mode (Currently %s)";
      sprintf(thirdLine,
              toggleKeyInstruction,
              this->AdvancedMode ? "On" : "Off");
    }
    sprintf(secondLine,
            "Press [h] for help           "
            "Press [q] to quit without generating");
    }

  curses_move(y-4,0);
  char fmt_s[] = "%s";
  char fmt[512] = "Press [enter] to edit option";
  if ( process )
    {
    strcpy(fmt, "                           ");
    }
  printw(fmt_s, fmt);
  curses_move(y-3,0);
  printw(fmt_s, firstLine);
  curses_move(y-2,0);
  printw(fmt_s, secondLine);
  curses_move(y-1,0);
  printw(fmt_s, thirdLine);

  if (cw)
    {
    sprintf(firstLine, "Page %d of %d", cw->GetPage(), this->NumberOfPages);
    curses_move(0,65-static_cast<unsigned int>(strlen(firstLine))-1);
    printw(fmt_s, firstLine);
    }
//    }

  pos_form_cursor(this->Form);

}